

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_run_container_union(array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  _Bool _Var2;
  rle16_t local_2c;
  int local_28;
  rle16_t previousrle;
  int32_t arraypos;
  int32_t rlepos;
  run_container_t *dst_local;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  _Var2 = run_container_is_full(src_2);
  if (_Var2) {
    run_container_copy(src_2,dst);
  }
  else {
    run_container_grow(dst,(src_1->cardinality + src_2->n_runs) * 2,false);
    previousrle.value = 0;
    previousrle.length = 0;
    local_28 = 0;
    if (*src_1->array < src_2->runs->value) {
      local_2c = run_container_append_value_first(dst,*src_1->array);
      local_28 = local_28 + 1;
    }
    else {
      local_2c = run_container_append_first(dst,*src_2->runs);
      previousrle = (rle16_t)((int)previousrle + 1);
    }
    while( true ) {
      bVar1 = false;
      if ((int)previousrle < src_2->n_runs) {
        bVar1 = local_28 < src_1->cardinality;
      }
      if (!bVar1) break;
      if (src_1->array[local_28] < src_2->runs[(int)previousrle].value) {
        run_container_append_value(dst,src_1->array[local_28],&local_2c);
        local_28 = local_28 + 1;
      }
      else {
        run_container_append(dst,src_2->runs[(int)previousrle],&local_2c);
        previousrle = (rle16_t)((int)previousrle + 1);
      }
    }
    if (local_28 < src_1->cardinality) {
      for (; local_28 < src_1->cardinality; local_28 = local_28 + 1) {
        run_container_append_value(dst,src_1->array[local_28],&local_2c);
      }
    }
    else {
      for (; (int)previousrle < src_2->n_runs; previousrle = (rle16_t)((int)previousrle + 1)) {
        run_container_append(dst,src_2->runs[(int)previousrle],&local_2c);
      }
    }
  }
  return;
}

Assistant:

void array_run_container_union(const array_container_t *src_1,
                               const run_container_t *src_2,
                               run_container_t *dst) {
    if (run_container_is_full(src_2)) {
        run_container_copy(src_2, dst);
        return;
    }
    // TODO: see whether the "2*" is spurious
    run_container_grow(dst, 2 * (src_1->cardinality + src_2->n_runs), false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    rle16_t previousrle;
    if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
        previousrle = run_container_append_first(dst, src_2->runs[rlepos]);
        rlepos++;
    } else {
        previousrle =
            run_container_append_value_first(dst, src_1->array[arraypos]);
        arraypos++;
    }
    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        } else {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    }
    if (arraypos < src_1->cardinality) {
        while (arraypos < src_1->cardinality) {
            run_container_append_value(dst, src_1->array[arraypos],
                                       &previousrle);
            arraypos++;
        }
    } else {
        while (rlepos < src_2->n_runs) {
            run_container_append(dst, src_2->runs[rlepos], &previousrle);
            rlepos++;
        }
    }
}